

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi_uc * stbi__psd_load(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  stbi_uc sVar1;
  byte bVar2;
  stbi__uint32 sVar3;
  int iVar4;
  int iVar5;
  stbi__uint32 sVar6;
  int iVar7;
  uint uVar8;
  undefined4 *in_RCX;
  stbi__uint32 *in_RDX;
  stbi__uint32 *in_RSI;
  stbi__context *in_RDI;
  int in_R8D;
  stbi_uc *p_1;
  stbi_uc val;
  stbi_uc *p;
  stbi_uc *out;
  int h;
  int w;
  int len;
  int count;
  int i;
  int channel;
  int compression;
  int channelCount;
  int pixelCount;
  undefined8 in_stack_ffffffffffffff78;
  stbi__context *s_00;
  stbi__context *in_stack_ffffffffffffff80;
  stbi_uc *local_70;
  uint in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  stbi_uc *in_stack_ffffffffffffffa0;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  uchar *local_8;
  
  iVar5 = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  sVar3 = stbi__get32be(in_stack_ffffffffffffff80);
  if (sVar3 == 0x38425053) {
    iVar4 = stbi__get16be(in_stack_ffffffffffffff80);
    if (iVar4 == 1) {
      stbi__skip(in_stack_ffffffffffffff80,iVar5);
      iVar5 = stbi__get16be(in_stack_ffffffffffffff80);
      if ((iVar5 < 0) || (0x10 < iVar5)) {
        stbi__err("wrong channel count");
        local_8 = (uchar *)0x0;
      }
      else {
        sVar3 = stbi__get32be(in_stack_ffffffffffffff80);
        sVar6 = stbi__get32be(in_stack_ffffffffffffff80);
        iVar4 = stbi__get16be(in_stack_ffffffffffffff80);
        if (iVar4 == 8) {
          iVar4 = stbi__get16be(in_stack_ffffffffffffff80);
          if (iVar4 == 3) {
            s_00 = in_RDI;
            stbi__get32be(in_stack_ffffffffffffff80);
            stbi__skip(in_stack_ffffffffffffff80,(int)((ulong)s_00 >> 0x20));
            stbi__get32be(in_RDI);
            stbi__skip(in_RDI,(int)((ulong)s_00 >> 0x20));
            stbi__get32be(in_RDI);
            stbi__skip(in_RDI,(int)((ulong)s_00 >> 0x20));
            iVar4 = stbi__get16be(in_RDI);
            if (iVar4 < 2) {
              local_8 = (uchar *)stbi__malloc(0x114514);
              if (local_8 == (uchar *)0x0) {
                stbi__err("outofmem");
                local_8 = (uchar *)0x0;
              }
              else {
                iVar7 = sVar6 * sVar3;
                if (iVar4 == 0) {
                  for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
                    local_70 = local_8 + local_3c;
                    if (iVar5 < local_3c) {
                      for (local_40 = 0; local_40 < iVar7; local_40 = local_40 + 1) {
                        sVar1 = '\0';
                        if (local_3c == 3) {
                          sVar1 = 0xff;
                        }
                        *local_70 = sVar1;
                        local_70 = local_70 + 4;
                      }
                    }
                    else {
                      for (local_40 = 0; local_40 < iVar7; local_40 = local_40 + 1) {
                        sVar1 = stbi__get8(s_00);
                        *local_70 = sVar1;
                        local_70 = local_70 + 4;
                      }
                    }
                  }
                }
                else {
                  stbi__skip(in_RDI,(int)((ulong)s_00 >> 0x20));
                  for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
                    in_stack_ffffffffffffffa0 = local_8 + local_3c;
                    if (local_3c < iVar5) {
                      local_44 = 0;
                      while (local_44 < iVar7) {
                        bVar2 = stbi__get8(s_00);
                        uVar8 = (uint)bVar2;
                        if (uVar8 != 0x80) {
                          if (uVar8 < 0x80) {
                            local_48 = uVar8 + 1;
                            local_44 = local_48 + local_44;
                            for (; local_48 != 0; local_48 = local_48 + -1) {
                              sVar1 = stbi__get8(s_00);
                              *in_stack_ffffffffffffffa0 = sVar1;
                              in_stack_ffffffffffffffa0 = in_stack_ffffffffffffffa0 + 4;
                            }
                          }
                          else if (0x80 < uVar8) {
                            local_48 = (uVar8 ^ 0xff) + 2;
                            sVar1 = stbi__get8(s_00);
                            in_stack_ffffffffffffff9c =
                                 CONCAT13(sVar1,(int3)in_stack_ffffffffffffff9c);
                            local_44 = local_48 + local_44;
                            for (; local_48 != 0; local_48 = local_48 + -1) {
                              *in_stack_ffffffffffffffa0 = sVar1;
                              in_stack_ffffffffffffffa0 = in_stack_ffffffffffffffa0 + 4;
                            }
                          }
                        }
                      }
                    }
                    else {
                      for (local_40 = 0; local_40 < iVar7; local_40 = local_40 + 1) {
                        sVar1 = '\0';
                        if (local_3c == 3) {
                          sVar1 = 0xff;
                        }
                        *in_stack_ffffffffffffffa0 = sVar1;
                        in_stack_ffffffffffffffa0 = in_stack_ffffffffffffffa0 + 4;
                      }
                    }
                  }
                }
                if (((in_R8D == 0) || (in_R8D == 4)) ||
                   (local_8 = stbi__convert_format
                                        (local_8,(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                                         (int)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                                         in_stack_ffffffffffffff98), local_8 != (uchar *)0x0)) {
                  if (in_RCX != (undefined4 *)0x0) {
                    *in_RCX = 4;
                  }
                  *in_RDX = sVar3;
                  *in_RSI = sVar6;
                }
              }
            }
            else {
              stbi__err("bad compression");
              local_8 = (uchar *)0x0;
            }
          }
          else {
            stbi__err("wrong color format");
            local_8 = (uchar *)0x0;
          }
        }
        else {
          stbi__err("unsupported bit depth");
          local_8 = (uchar *)0x0;
        }
      }
    }
    else {
      stbi__err("wrong version");
      local_8 = (uchar *)0x0;
    }
  }
  else {
    stbi__err("not PSD");
    local_8 = (uchar *)0x0;
  }
  return local_8;
}

Assistant:

static stbi_uc *stbi__psd_load(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   int   pixelCount;
   int channelCount, compression;
   int channel, i, count, len;
   int w,h;
   stbi_uc *out;

   // Check identifier
   if (stbi__get32be(s) != 0x38425053)   // "8BPS"
      return stbi__errpuc("not PSD", "Corrupt PSD image");

   // Check file type version.
   if (stbi__get16be(s) != 1)
      return stbi__errpuc("wrong version", "Unsupported version of PSD image");

   // Skip 6 reserved bytes.
   stbi__skip(s, 6 );

   // Read the number of channels (R, G, B, A, etc).
   channelCount = stbi__get16be(s);
   if (channelCount < 0 || channelCount > 16)
      return stbi__errpuc("wrong channel count", "Unsupported number of channels in PSD image");

   // Read the rows and columns of the image.
   h = stbi__get32be(s);
   w = stbi__get32be(s);

   // Make sure the depth is 8 bits.
   if (stbi__get16be(s) != 8)
      return stbi__errpuc("unsupported bit depth", "PSD bit depth is not 8 bit");

   // Make sure the color mode is RGB.
   // Valid options are:
   //   0: Bitmap
   //   1: Grayscale
   //   2: Indexed color
   //   3: RGB color
   //   4: CMYK color
   //   7: Multichannel
   //   8: Duotone
   //   9: Lab color
   if (stbi__get16be(s) != 3)
      return stbi__errpuc("wrong color format", "PSD is not in RGB color format");

   // Skip the Mode Data.  (It's the palette for indexed color; other info for other modes.)
   stbi__skip(s,stbi__get32be(s) );

   // Skip the image resources.  (resolution, pen tool paths, etc)
   stbi__skip(s, stbi__get32be(s) );

   // Skip the reserved data.
   stbi__skip(s, stbi__get32be(s) );

   // Find out if the data is compressed.
   // Known values:
   //   0: no compression
   //   1: RLE compressed
   compression = stbi__get16be(s);
   if (compression > 1)
      return stbi__errpuc("bad compression", "PSD has an unknown compression format");

   // Create the destination image.
   out = (stbi_uc *) stbi__malloc(4 * w*h);
   if (!out) return stbi__errpuc("outofmem", "Out of memory");
   pixelCount = w*h;

   // Initialize the data to zero.
   //memset( out, 0, pixelCount * 4 );

   // Finally, the image data.
   if (compression) {
      // RLE as used by .PSD and .TIFF
      // Loop until you get the number of unpacked bytes you are expecting:
      //     Read the next source byte into n.
      //     If n is between 0 and 127 inclusive, copy the next n+1 bytes literally.
      //     Else if n is between -127 and -1 inclusive, copy the next byte -n+1 times.
      //     Else if n is 128, noop.
      // Endloop

      // The RLE-compressed data is preceeded by a 2-byte data count for each row in the data,
      // which we're going to just skip.
      stbi__skip(s, h * channelCount * 2 );

      // Read the RLE data by channel.
      for (channel = 0; channel < 4; channel++) {
         stbi_uc *p;

         p = out+channel;
         if (channel >= channelCount) {
            // Fill this channel with default data.
            for (i = 0; i < pixelCount; i++, p += 4)
               *p = (channel == 3 ? 255 : 0);
         } else {
            // Read the RLE data.
            count = 0;
            while (count < pixelCount) {
               len = stbi__get8(s);
               if (len == 128) {
                  // No-op.
               } else if (len < 128) {
                  // Copy next len+1 bytes literally.
                  len++;
                  count += len;
                  while (len) {
                     *p = stbi__get8(s);
                     p += 4;
                     len--;
                  }
               } else if (len > 128) {
                  stbi_uc   val;
                  // Next -len+1 bytes in the dest are replicated from next source byte.
                  // (Interpret len as a negative 8-bit int.)
                  len ^= 0x0FF;
                  len += 2;
                  val = stbi__get8(s);
                  count += len;
                  while (len) {
                     *p = val;
                     p += 4;
                     len--;
                  }
               }
            }
         }
      }

   } else {
      // We're at the raw image data.  It's each channel in order (Red, Green, Blue, Alpha, ...)
      // where each channel consists of an 8-bit value for each pixel in the image.

      // Read the data by channel.
      for (channel = 0; channel < 4; channel++) {
         stbi_uc *p;

         p = out + channel;
         if (channel > channelCount) {
            // Fill this channel with default data.
            for (i = 0; i < pixelCount; i++, p += 4)
               *p = channel == 3 ? 255 : 0;
         } else {
            // Read the data.
            for (i = 0; i < pixelCount; i++, p += 4)
               *p = stbi__get8(s);
         }
      }
   }

   if (req_comp && req_comp != 4) {
      out = stbi__convert_format(out, 4, req_comp, w, h);
      if (out == NULL) return out; // stbi__convert_format frees input on failure
   }

   if (comp) *comp = 4;
   *y = h;
   *x = w;

   return out;
}